

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentiment.cpp
# Opt level: O2

PyObject * PyInit_sentiment(void)

{
  int iVar1;
  char *__s1;
  class_<KNNClassifier> *this;
  class_<PCA> *this_00;
  module m;
  arg local_100;
  _func_pair<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_Matrix<double,__1,__1,_1,__1,__1>_ptr_uint_uint_double
  *local_f0;
  double local_e8;
  arg local_e0;
  int local_cc;
  arg local_c8;
  arg_v local_b8;
  arg local_78;
  arg_v local_68;
  
  __s1 = (char *)Py_GetVersion();
  iVar1 = strncmp(__s1,"3.10",4);
  if ((iVar1 == 0) && (9 < (byte)(__s1[4] - 0x30U))) {
    pybind11::module::module(&m,"sentiment",(char *)0x0);
    pybind11::class_<KNNClassifier>::class_<>
              ((class_<KNNClassifier> *)&local_100,(handle)m.super_object.super_handle.m_ptr,
               "KNNClassifier");
    pybind11::detail::initimpl::constructor<unsigned_int>::
    execute<pybind11::class_<KNNClassifier>,_0>((class_<KNNClassifier> *)&local_100);
    local_b8.super_arg.name = (char *)KNNClassifier::fit;
    local_b8.super_arg._8_8_ = 0;
    this = pybind11::class_<KNNClassifier>::
           def<void(KNNClassifier::*)(Eigen::SparseMatrix<double,1,int>,Eigen::Matrix<double,_1,_1,1,_1,_1>)>
                     ((class_<KNNClassifier> *)&local_100,"fit",
                      (offset_in_KNNClassifier_to_subr *)&local_b8);
    local_68.super_arg.name = (char *)KNNClassifier::predict;
    local_68.super_arg._8_8_ = 0;
    pybind11::class_<KNNClassifier>::
    def<Eigen::Matrix<double,_1,1,0,_1,1>(KNNClassifier::*)(Eigen::SparseMatrix<double,1,int>)>
              (this,"predict",(offset_in_KNNClassifier_to_subr *)&local_68);
    pybind11::object::~object((object *)&local_100);
    pybind11::class_<PCA>::class_<>
              ((class_<PCA> *)&local_100,(handle)m.super_object.super_handle.m_ptr,"PCA");
    pybind11::detail::initimpl::constructor<unsigned_int>::execute<pybind11::class_<PCA>,_0>
              ((class_<PCA> *)&local_100);
    local_b8.super_arg.name = (char *)PCA::fit;
    local_b8.super_arg._8_8_ = 0;
    this_00 = pybind11::class_<PCA>::def<void(PCA::*)(Eigen::Matrix<double,_1,_1,1,_1,_1>)>
                        ((class_<PCA> *)&local_100,"fit",
                         (offset_in_KNNClassifier_to_subr *)&local_b8);
    local_68.super_arg.name = (char *)PCA::transform;
    local_68.super_arg._8_8_ = 0;
    pybind11::class_<PCA>::
    def<Eigen::Matrix<double,_1,_1,0,_1,_1>(PCA::*)(Eigen::SparseMatrix<double,1,int>)>
              (this_00,"transform",(offset_in_KNNClassifier_to_subr *)&local_68);
    pybind11::object::~object((object *)&local_100);
    local_c8.name = (char *)power_iteration;
    local_100.name = "X";
    local_100._8_1_ = 2;
    local_e8 = (double)CONCAT44(local_e8._4_4_,5000);
    local_e0.name = "num_iter";
    local_e0._8_1_ = 2;
    pybind11::arg::operator=(&local_b8,&local_e0,(int *)&local_e8);
    local_f0 = (_func_pair<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_Matrix<double,__1,__1,_1,__1,__1>_ptr_uint_uint_double
                *)0x3c9cd2b297d889bc;
    local_78.name = "epsilon";
    local_78._8_1_ = 2;
    pybind11::arg::operator=(&local_68,&local_78,(double *)&local_f0);
    pybind11::module::
    def<std::pair<double,Eigen::Matrix<double,_1,1,0,_1,1>>(*)(Eigen::Matrix<double,_1,_1,1,_1,_1>const&,unsigned_int,double),char[37],pybind11::arg,pybind11::arg_v,pybind11::arg_v>
              (&m,"power_iteration",
               (_func_pair<double,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_Matrix<double,__1,__1,_1,__1,__1>_ptr_uint_double
                **)&local_c8,(char (*) [37])"Function that calculates eigenvector",&local_100,
               &local_b8,&local_68);
    pybind11::arg_v::~arg_v(&local_68);
    pybind11::arg_v::~arg_v(&local_b8);
    local_f0 = get_first_eigenvalues;
    local_100.name = "X";
    local_100._8_1_ = 2;
    local_e0.name = "num";
    local_e0._8_1_ = 2;
    local_cc = 5000;
    local_78.name = "num_iter";
    local_78._8_1_ = 2;
    pybind11::arg::operator=(&local_b8,&local_78,&local_cc);
    local_e8 = 1e-16;
    local_c8.name = "epsilon";
    local_c8._8_1_ = 2;
    pybind11::arg::operator=(&local_68,&local_c8,&local_e8);
    pybind11::module::
    def<std::pair<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,_1,1,_1,_1>>(*)(Eigen::Matrix<double,_1,_1,1,_1,_1>const&,unsigned_int,unsigned_int,double),char[37],pybind11::arg,pybind11::arg,pybind11::arg_v,pybind11::arg_v>
              (&m,"get_first_eigenvalues",&local_f0,
               (char (*) [37])"Function that calculates eigenvector",&local_100,&local_e0,&local_b8,
               &local_68);
    pybind11::arg_v::~arg_v(&local_68);
    pybind11::arg_v::~arg_v(&local_b8);
    pybind11::object::~object(&m.super_object);
  }
  else {
    PyErr_Format(_PyExc_ImportError,
                 "Python version mismatch: module was compiled for Python %s, but the interpreter version is incompatible: %s."
                 ,"3.10",__s1);
    m.super_object.super_handle.m_ptr = (object)(object)(PyObject *)0x0;
  }
  return (PyObject *)m.super_object.super_handle.m_ptr;
}

Assistant:

PYBIND11_MODULE(sentiment, m) {
    py::class_<KNNClassifier>(m, "KNNClassifier")
        .def(py::init<unsigned int>())
        .def("fit", &KNNClassifier::fit)
        .def("predict", &KNNClassifier::predict);

    py::class_<PCA>(m, "PCA")
        .def(py::init<unsigned int>())
        .def("fit", &PCA::fit)
        .def("transform", &PCA::transform);
    m.def(
        "power_iteration", &power_iteration,
        "Function that calculates eigenvector",
        py::arg("X"),
        py::arg("num_iter")=5000,
        py::arg("epsilon")=1e-16
    );
    m.def(
        "get_first_eigenvalues", &get_first_eigenvalues,
        "Function that calculates eigenvector",
        py::arg("X"),
        py::arg("num"),
        py::arg("num_iter")=5000,
        py::arg("epsilon")=1e-16
    );

}